

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

int64_t __thiscall
aeron::archive::AeronArchive::callAndPollForDescriptors
          (AeronArchive *this,function<bool_(long)> *f,int32_t recordCount,
          RecordingDescriptorConsumer *consumer,char *request)

{
  bool bVar1;
  int64_t iVar2;
  ArchiveException *this_00;
  char *pcVar3;
  allocator local_c3;
  allocator local_c2;
  allocator local_c1;
  unique_lock<std::mutex> lock;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->lock_);
  iVar2 = concurrent::ringbuffer::ManyToOneRingBuffer::nextCorrelationId
                    (&((this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_toDriverRingBuffer);
  bVar1 = std::function<bool_(long)>::operator()(f,iVar2);
  if (bVar1) {
    iVar2 = pollForDescriptors(this,iVar2,recordCount,consumer);
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    return iVar2;
  }
  this_00 = (ArchiveException *)__cxa_allocate_exception(0x48);
  std::__cxx11::string::string((string *)&local_70,request,&local_c1);
  std::operator+(&local_50,&local_70,": failed to send");
  std::__cxx11::string::string
            ((string *)&local_90,
             "std::int64_t aeron::archive::AeronArchive::callAndPollForDescriptors(std::function<bool (std::int64_t)> &&, std::int32_t, RecordingDescriptorConsumer &&, const char *)"
             ,&local_c2);
  pcVar3 = aeron::util::past_prefix
                     ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                     );
  std::__cxx11::string::string((string *)&local_b0,pcVar3,&local_c3);
  ArchiveException::ArchiveException(this_00,&local_50,&local_90,&local_b0,0x1ce);
  __cxa_throw(this_00,&ArchiveException::typeinfo,aeron::util::SourcedException::~SourcedException);
}

Assistant:

std::int64_t AeronArchive::callAndPollForDescriptors(std::function<bool(std::int64_t)>&& f, std::int32_t recordCount,
                                                     RecordingDescriptorConsumer&& consumer, const char* request) {
    std::unique_lock<std::mutex> lock(lock_);

    std::int64_t correlationId = aeron_->nextCorrelationId();

    if (!f(correlationId)) {
        throw ArchiveException(std::string(request) + ": failed to send", SOURCEINFO);
    }

    return pollForDescriptors(correlationId, recordCount, std::move(consumer));
}